

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_bounding_box_diagonal(REF_NODE ref_node,REF_DBL *diagonal)

{
  double dVar1;
  int iVar2;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  double dVar11;
  REF_DBL temp;
  REF_DBL max_xyz [3];
  REF_DBL min_xyz [3];
  undefined8 local_70;
  double local_68 [4];
  double local_48 [4];
  
  ref_mpi = ref_node->ref_mpi;
  lVar6 = 0;
  do {
    local_48[lVar6] = 1e+200;
    local_68[lVar6] = -1e+200;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  iVar2 = ref_node->max;
  if (0 < (long)iVar2) {
    pRVar3 = ref_node->global;
    lVar6 = 0;
    lVar8 = 0;
    do {
      if (-1 < pRVar3[lVar8]) {
        pRVar4 = ref_node->real;
        lVar9 = 0;
        do {
          dVar1 = *(double *)((long)pRVar4 + lVar9 * 8 + lVar6);
          dVar11 = local_48[lVar9];
          if (dVar1 <= local_48[lVar9]) {
            dVar11 = dVar1;
          }
          local_48[lVar9] = dVar11;
          dVar11 = local_68[lVar9];
          if (local_68[lVar9] <= dVar1) {
            dVar11 = dVar1;
          }
          local_68[lVar9] = dVar11;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0x78;
    } while (lVar8 != iVar2);
  }
  lVar6 = 0;
  while( true ) {
    local_70 = *(undefined8 *)((long)local_48 + lVar6);
    uVar5 = ref_mpi_min(ref_mpi,&local_70,(undefined8 *)((long)local_48 + lVar6),3);
    if (uVar5 != 0) {
      pcVar10 = "mpi min";
      uVar7 = 0xd26;
      goto LAB_00143abc;
    }
    local_70 = *(undefined8 *)((long)local_68 + lVar6);
    uVar5 = ref_mpi_max(ref_mpi,&local_70,(undefined8 *)((long)local_68 + lVar6),3);
    if (uVar5 != 0) break;
    lVar6 = lVar6 + 8;
    if (lVar6 == 0x18) {
      if (ref_mpi->id == 0) {
        *diagonal = SQRT((local_68[2] - local_48[2]) * (local_68[2] - local_48[2]) +
                         (local_68[1] - local_48[1]) * (local_68[1] - local_48[1]) +
                         (local_68[0] - local_48[0]) * (local_68[0] - local_48[0]));
      }
      uVar5 = ref_mpi_bcast(ref_mpi,diagonal,1,3);
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        pcVar10 = "bcast";
        uVar7 = 0xd2f;
LAB_00143abc:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               uVar7,"ref_node_bounding_box_diagonal",(ulong)uVar5,pcVar10);
      }
      return uVar5;
    }
  }
  pcVar10 = "mpi max";
  uVar7 = 0xd28;
  goto LAB_00143abc;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_box_diagonal(REF_NODE ref_node,
                                                  REF_DBL *diagonal) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_DBL min_xyz[3], max_xyz[3], temp;
  REF_INT node, i;
  for (i = 0; i < 3; i++) {
    min_xyz[i] = REF_DBL_MAX;
    max_xyz[i] = REF_DBL_MIN;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 3; i++) {
      min_xyz[i] = MIN(min_xyz[i], ref_node_xyz(ref_node, i, node));
      max_xyz[i] = MAX(max_xyz[i], ref_node_xyz(ref_node, i, node));
    }
  }
  for (i = 0; i < 3; i++) {
    temp = min_xyz[i];
    RSS(ref_mpi_min(ref_mpi, &temp, &(min_xyz[i]), REF_DBL_TYPE), "mpi min");
    temp = max_xyz[i];
    RSS(ref_mpi_max(ref_mpi, &temp, &(max_xyz[i]), REF_DBL_TYPE), "mpi max");
  }
  if (ref_mpi_once(ref_mpi)) {
    *diagonal =
        sqrt(pow(max_xyz[0] - min_xyz[0], 2) + pow(max_xyz[1] - min_xyz[1], 2) +
             pow(max_xyz[2] - min_xyz[2], 2));
  }
  RSS(ref_mpi_bcast(ref_mpi, diagonal, 1, REF_DBL_TYPE), "bcast");
  return REF_SUCCESS;
}